

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

bool save_wav16(string *fname,vector<float,_std::allocator<float>_> *data,int sample_rate)

{
  byte bVar1;
  bool bVar2;
  common_log *log;
  undefined8 uVar3;
  size_type sVar4;
  int in_EDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  string *in_RDI;
  int16_t pcm_sample;
  float *sample;
  const_iterator __end1;
  const_iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  wav_header header;
  ofstream file;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
  *in_stack_fffffffffffffd40;
  double local_2a0;
  double local_298;
  double local_290;
  undefined2 local_282;
  reference local_280;
  float *local_278;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_270 [2];
  wav_header local_25c;
  undefined4 local_230;
  long local_220 [4];
  bool local_1;
  
  std::ofstream::ofstream(local_220,in_RDI,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    wav_header::wav_header(&local_25c);
    local_25c.byte_rate =
         in_EDX * (uint)local_25c.num_channels * (uint)(local_25c.bits_per_sample >> 3);
    local_25c.block_align = local_25c.num_channels * (local_25c.bits_per_sample >> 3);
    sVar4 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    local_25c.data_size = (int)sVar4 * (uint)(local_25c.bits_per_sample >> 3);
    local_25c.chunk_size = local_25c.data_size + 0x24;
    std::ostream::write((char *)local_220,(long)&local_25c);
    local_270[0]._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)
                             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    local_278 = (float *)std::vector<float,_std::allocator<float>_>::end
                                   ((vector<float,_std::allocator<float>_> *)
                                    CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffd40,
                         (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      if (!bVar2) break;
      local_280 = __gnu_cxx::
                  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                  operator*(local_270);
      local_290 = (double)*local_280 * 32767.0;
      local_298 = -32768.0;
      local_2a0 = 32767.0;
      in_stack_fffffffffffffd40 =
           (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
           std::clamp<double>(&local_290,&local_298,&local_2a0);
      local_282 = (undefined2)(int)(double)in_stack_fffffffffffffd40->_M_current;
      std::ostream::write((char *)local_220,(long)&local_282);
      __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
      operator++(local_270);
    }
    bVar1 = std::ios::good();
    local_1 = (bool)(bVar1 & 1);
  }
  else {
    if (-1 < common_log_verbosity_thold) {
      log = common_log_main();
      uVar3 = std::__cxx11::string::c_str();
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: Failed to open file \'%s\' for writing.\n",
                     "save_wav16",uVar3);
    }
    local_1 = false;
  }
  local_230 = 1;
  std::ofstream::~ofstream(local_220);
  return local_1;
}

Assistant:

static bool save_wav16(const std::string & fname, const std::vector<float> & data, int sample_rate) {
    std::ofstream file(fname, std::ios::binary);
    if (!file) {
        LOG_ERR("%s: Failed to open file '%s' for writing.\n", __func__, fname.c_str());
        return false;
    }

    wav_header header;
    header.sample_rate = sample_rate;
    header.byte_rate = header.sample_rate * header.num_channels * (header.bits_per_sample / 8);
    header.block_align = header.num_channels * (header.bits_per_sample / 8);
    header.data_size = data.size() * (header.bits_per_sample / 8);
    header.chunk_size = 36 + header.data_size;

    file.write(reinterpret_cast<const char*>(&header), sizeof(header));

    for (const auto & sample : data) {
        int16_t pcm_sample = static_cast<int16_t>(std::clamp(sample * 32767.0, -32768.0, 32767.0));
        file.write(reinterpret_cast<const char*>(&pcm_sample), sizeof(pcm_sample));
    }

    return file.good();
}